

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  clock_t cVar1;
  ostream *poVar2;
  clock_t cVar3;
  clock_t t;
  undefined1 local_68 [8];
  string outputFile;
  allocator<char> local_31;
  string local_30 [8];
  string inputFile;
  
  inputFile.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"../data/test_data.txt",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_68,"../projects/student/result.txt",(allocator<char> *)((long)&t + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&t + 7));
  cVar1 = clock();
  init((EVP_PKEY_CTX *)local_30);
  poVar2 = std::operator<<((ostream *)&std::cout,"time:");
  cVar3 = clock();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)(cVar3 - cVar1) / 1000000.0);
  poVar2 = std::operator<<(poVar2,"s");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  cVar1 = clock();
  run();
  poVar2 = std::operator<<((ostream *)&std::cout,"time:");
  cVar3 = clock();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)(cVar3 - cVar1) / 1000000.0);
  poVar2 = std::operator<<(poVar2,"s");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  cVar1 = clock();
  output((string *)local_68);
  poVar2 = std::operator<<((ostream *)&std::cout,"time:");
  cVar3 = clock();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)(cVar3 - cVar1) / 1000000.0);
  poVar2 = std::operator<<(poVar2,"s");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,ansNum);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  inputFile.field_2._12_4_ = 0;
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_30);
  return inputFile.field_2._12_4_;
}

Assistant:

int main() {
    string inputFile = "../data/test_data.txt";
    string outputFile = "../projects/student/result.txt";
    auto t = clock();
    init(inputFile);
    cout << "time:" << double(clock() - t) / CLOCKS_PER_SEC << "s" << endl;
    t = clock();
    run();
    cout << "time:" << double(clock() - t) / CLOCKS_PER_SEC << "s" << endl;
    t = clock();
    output(outputFile);
    cout << "time:" << double(clock() - t) / CLOCKS_PER_SEC << "s" << endl;
    cout << ansNum << endl;

    return 0;
}